

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportGlobal
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  pointer *__ptr;
  undefined1 local_f8 [8];
  string_view field_name_local;
  string_view module_name_local;
  GlobalType global_type;
  string local_b8;
  string local_98;
  ImportType local_78;
  
  module_name_local.size_ = module_name.size_;
  module_name_local.data_ = module_name.data_;
  field_name_local.size_ = field_name.size_;
  field_name_local.data_ = field_name.data_;
  RVar2 = SharedValidator::OnGlobalImport
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     type,mutable_);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    global_type.super_ExternType.kind = Global;
    global_type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00228590;
    global_type.super_ExternType._12_4_ = type.enum_;
    pMVar1 = this->module_;
    global_type.mut = (uint)mutable_;
    string_view::to_string_abi_cxx11_(&local_98,&module_name_local);
    string_view::to_string_abi_cxx11_(&local_b8,&field_name_local);
    GlobalType::Clone((GlobalType *)local_f8);
    ImportType::ImportType
              (&local_78,&local_98,&local_b8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_f8);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_78);
    ImportType::~ImportType(&local_78);
    if ((tuple<wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>)local_f8
        != (_Head_base<0UL,_wabt::interp::ExternType_*,_false>)0x0) {
      (**(code **)(*(_func_int **)local_f8 + 8))();
    }
    local_f8 = (undefined1  [8])0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,&global_type);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportGlobal(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index global_index,
                                          Type type,
                                          bool mutable_) {
  CHECK_RESULT(validator_.OnGlobalImport(loc, type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), global_type.Clone())});
  global_types_.push_back(global_type);
  return Result::Ok;
}